

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SlidingWindowsLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_slidingwindows
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  SlidingWindowsLayerParams *pSVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_slidingwindows(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_slidingwindows(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pSVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::SlidingWindowsLayerParams>(arena);
    (this->layer_).slidingwindows_ = pSVar2;
  }
  return (SlidingWindowsLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SlidingWindowsLayerParams* NeuralNetworkLayer::_internal_mutable_slidingwindows() {
  if (!_internal_has_slidingwindows()) {
    clear_layer();
    set_has_slidingwindows();
    layer_.slidingwindows_ = CreateMaybeMessage< ::CoreML::Specification::SlidingWindowsLayerParams >(GetArenaForAllocation());
  }
  return layer_.slidingwindows_;
}